

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void ps_lattice_link2itor(ps_seg_t *seg,ps_latlink_t *link,int to)

{
  logmath_t *lmath_00;
  int iVar1;
  char *local_50;
  logmath_t *lmath;
  ps_latnode_t *n;
  latlink_list_t *x;
  ps_latnode_t *node;
  dag_seg_t *itor;
  int to_local;
  ps_latlink_t *link_local;
  ps_seg_t *seg_local;
  
  if (to == 0) {
    lmath_00 = seg->search->acmod->lmath;
    x = (latlink_list_t *)link->from;
    seg->ef = link->ef;
    seg->prob = (link->alpha + link->beta) - *(int *)&seg[1].search;
    for (lmath = (logmath_t *)x; lmath != (logmath_t *)0x0;
        lmath = (logmath_t *)lmath->inv_log_of_base) {
      for (n = (ps_latnode_t *)lmath->log_of_base; n != (ps_latnode_t *)0x0;
          n = *(ps_latnode_t **)&n->basewid) {
        if (*(ps_latlink_t **)n != link) {
          iVar1 = logmath_add(lmath_00,seg->prob,
                              (*(int *)(*(long *)n + 0x24) + *(int *)(*(long *)n + 0x28)) -
                              *(int *)&seg[1].search);
          seg->prob = iVar1;
        }
      }
    }
  }
  else {
    x = (latlink_list_t *)link->to;
    seg->ef = ((ps_latnode_s *)x)->lef;
    seg->prob = 0;
  }
  if (*(int *)((long)&x->link + 4) < 0) {
    local_50 = (char *)0x0;
  }
  else {
    local_50 = seg->search->dict->word[*(int *)((long)&x->link + 4)].word;
  }
  seg->text = local_50;
  seg->wid = *(s3wid_t *)((long)&x->link + 4);
  seg->sf = *(frame_idx_t *)((long)&x[1].link + 4);
  seg->ascr = link->ascr << 10;
  ps_lattice_compute_lscr(seg,link,to);
  return;
}

Assistant:

static void
ps_lattice_link2itor(ps_seg_t *seg, ps_latlink_t *link, int to)
{
    dag_seg_t *itor = (dag_seg_t *)seg;
    ps_latnode_t *node;

    if (to) {
        node = link->to;
        seg->ef = node->lef;
        seg->prob = 0; /* norm + beta - norm */
    }
    else {
        latlink_list_t *x;
        ps_latnode_t *n;
        logmath_t *lmath = ps_search_acmod(seg->search)->lmath;

        node = link->from;
        seg->ef = link->ef;
        seg->prob = link->alpha + link->beta - itor->norm;
        /* Sum over all exits for this word and any alternate
           pronunciations at the same frame. */
        for (n = node; n; n = n->alt) {
            for (x = n->exits; x; x = x->next) {
                if (x->link == link)
                    continue;
                seg->prob = logmath_add(lmath, seg->prob,
                                        x->link->alpha + x->link->beta - itor->norm);
            }
        }
    }
    seg->text = dict_wordstr(ps_search_dict(seg->search), node->wid);
    seg->wid = node->wid;
    seg->sf = node->sf;
    seg->ascr = link->ascr << SENSCR_SHIFT;
    /* Compute language model score from best predecessors. */
    ps_lattice_compute_lscr(seg, link, to);
}